

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_ia5_string(uchar **p,uchar *start,char *text,size_t text_len)

{
  int iVar1;
  int iVar2;
  size_t len;
  int ret;
  size_t text_len_local;
  char *text_local;
  uchar *start_local;
  uchar **p_local;
  
  iVar1 = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)text,text_len);
  p_local._4_4_ = iVar1;
  if ((-1 < iVar1) &&
     (iVar2 = mbedtls_asn1_write_len(p,start,(long)iVar1), p_local._4_4_ = iVar2, -1 < iVar2)) {
    p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'\x16');
    if (-1 < p_local._4_4_) {
      p_local._4_4_ = p_local._4_4_ + iVar2 + iVar1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_ia5_string( unsigned char **p, unsigned char *start,
                           const char *text, size_t text_len )
{
    int ret;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_raw_buffer( p, start,
                  (const unsigned char *) text, text_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_IA5_STRING ) );

    return( (int) len );
}